

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O0

void __thiscall ftxui::Border::Border(Border *this,Elements *children,Pixel *pixel)

{
  allocator<ftxui::Pixel> local_45 [13];
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_38;
  Pixel *local_20;
  Pixel *pixel_local;
  Elements *children_local;
  Border *this_local;
  
  local_20 = pixel;
  pixel_local = (Pixel *)children;
  children_local = (Elements *)this;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_38,children);
  Node::Node(&this->super_Node,&local_38);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_38);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Border_00219f30;
  std::allocator<ftxui::Pixel>::allocator(local_45);
  std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::vector
            (&this->charset_pixel,10,pixel,local_45);
  std::allocator<ftxui::Pixel>::~allocator(local_45);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->charset);
  return;
}

Assistant:

Border(Elements children, Pixel pixel)
      : Node(std::move(children)), charset_pixel(10, pixel) {}